

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# folding_rules.cpp
# Opt level: O2

bool spvtools::opt::anon_unknown_0::CompositeInsertToCompositeConstruct
               (IRContext *context,Instruction *inst,
               vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
               *param_3)

{
  _Rb_tree_header *p_Var1;
  int *piVar2;
  bool bVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  int iVar6;
  DefUseManager *pDVar7;
  size_type sVar8;
  Instruction *pIVar9;
  TypeManager *this;
  Type *pTVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar11;
  _Base_ptr p_Var12;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  ulong uStack_f0;
  uint32_t local_dc;
  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  values_inserted_1;
  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  values_inserted;
  uint32_t partially_inserted_element_index;
  undefined4 uStack_74;
  pointer puStack_70;
  PodType local_68 [2];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  if (inst->opcode_ != OpCompositeInsert) {
    __assert_fail("inst->opcode() == spv::Op::OpCompositeInsert && \"Wrong opcode.  Should be OpCompositeInsert.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/folding_rules.cpp"
                  ,0x862,
                  "bool spvtools::opt::(anonymous namespace)::CompositeInsertToCompositeConstruct(IRContext *, Instruction *, const std::vector<const analysis::Constant *> &)"
                 );
  }
  uVar4 = Instruction::NumInOperands(inst);
  if (uVar4 < 3) {
    return false;
  }
  pDVar7 = IRContext::get_def_use_mgr(inst->context_);
  values_inserted_1._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &values_inserted_1._M_t._M_impl.super__Rb_tree_header._M_header;
  values_inserted_1._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  values_inserted_1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  values_inserted_1._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pIVar9 = inst;
  values_inserted_1._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       values_inserted_1._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while (pIVar9->opcode_ == OpCompositeInsert) {
    uVar4 = Instruction::NumInOperands(pIVar9);
    uVar5 = Instruction::NumInOperands(inst);
    if (uVar5 < uVar4) {
      uVar4 = Instruction::NumInOperands(inst);
      uVar4 = Instruction::GetSingleWordInOperand(pIVar9,uVar4 - 1);
      _partially_inserted_element_index = (_func_int **)CONCAT44(uStack_74,uVar4);
      sVar8 = std::
              map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
              ::count(&values_inserted_1,&partially_inserted_element_index);
      if (sVar8 == 0) {
        values_inserted._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &values_inserted._M_t._M_impl.super__Rb_tree_header._M_header;
        values_inserted._M_t._M_impl._0_8_ = 0;
        values_inserted._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        values_inserted._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        values_inserted._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        values_inserted._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        values_inserted._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             values_inserted._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        goto LAB_004bc76b;
      }
    }
    bVar3 = HaveSameIndexesExceptForLast(inst,pIVar9);
    if (bVar3) {
      uVar4 = Instruction::NumInOperands(pIVar9);
      uVar4 = Instruction::GetSingleWordInOperand(pIVar9,uVar4 - 1);
      values_inserted._M_t._M_impl._4_4_ = Instruction::GetSingleWordInOperand(pIVar9,0);
      values_inserted._M_t._M_impl._0_4_ = uVar4;
      std::
      _Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
      ::_M_insert_unique<std::pair<unsigned_int_const,unsigned_int>>
                ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
                  *)&values_inserted_1,(pair<const_unsigned_int,_unsigned_int> *)&values_inserted);
    }
    uVar4 = Instruction::GetSingleWordInOperand(pIVar9,1);
    pIVar9 = analysis::DefUseManager::GetDef(pDVar7,uVar4);
  }
  std::_Rb_tree_header::_Rb_tree_header
            (&values_inserted._M_t._M_impl.super__Rb_tree_header,
             &values_inserted_1._M_t._M_impl.super__Rb_tree_header);
LAB_004bc76b:
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::~_Rb_tree(&values_inserted_1._M_t);
  if (inst->opcode_ != OpCompositeInsert) {
    __assert_fail("inst->opcode() == spv::Op::OpCompositeInsert",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/folding_rules.cpp"
                  ,0x833,
                  "uint32_t spvtools::opt::(anonymous namespace)::GetContainerTypeId(Instruction *)"
                 );
  }
  pDVar7 = IRContext::get_def_use_mgr(inst->context_);
  uVar4 = Instruction::type_id(inst);
  uVar4 = GetElementType(uVar4,(inst->operands_).
                               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                               ._M_impl.super__Vector_impl_data._M_start + 4,
                         (inst->operands_).
                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                         ._M_impl.super__Vector_impl_data._M_finish + -1,pDVar7);
  if (uVar4 != 0) {
    this = IRContext::get_type_mgr(context);
    pTVar10 = analysis::TypeManager::GetType(this,uVar4);
    if (pTVar10 == (Type *)0x0) {
      __assert_fail("container_type && \"GetContainerTypeId returned a bad id.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/folding_rules.cpp"
                    ,0x86d,
                    "bool spvtools::opt::(anonymous namespace)::CompositeInsertToCompositeConstruct(IRContext *, Instruction *, const std::vector<const analysis::Constant *> &)"
                   );
    }
    iVar6 = (*pTVar10->_vptr_Type[0xe])(pTVar10);
    lVar11 = CONCAT44(extraout_var,iVar6);
    if (lVar11 == 0) {
      iVar6 = (*pTVar10->_vptr_Type[0x10])(pTVar10);
      lVar11 = CONCAT44(extraout_var_00,iVar6);
      if (lVar11 != 0) goto LAB_004bc7fa;
      iVar6 = (*pTVar10->_vptr_Type[0x1e])(pTVar10);
      lVar11 = CONCAT44(extraout_var_01,iVar6);
      if (lVar11 == 0) {
        iVar6 = (*pTVar10->_vptr_Type[0x18])(pTVar10);
        lVar11 = CONCAT44(extraout_var_02,iVar6);
        if (lVar11 == 0) {
          uStack_f0 = 0;
        }
        else {
          piVar2 = *(int **)(lVar11 + 0x38);
          uStack_f0 = 0xffffffffffffffff;
          if ((*piVar2 == 0) &&
             (uStack_f0 = 0xffffffffffffffff, *(long *)(lVar11 + 0x40) - (long)piVar2 == 8)) {
            uStack_f0 = (ulong)(uint)piVar2[1];
          }
        }
      }
      else {
        uStack_f0 = (ulong)(*(long *)(lVar11 + 0x30) - *(long *)(lVar11 + 0x28)) >> 3;
      }
    }
    else {
LAB_004bc7fa:
      uStack_f0 = (ulong)*(uint *)(lVar11 + 0x30);
    }
    if (values_inserted._M_t._M_impl.super__Rb_tree_header._M_node_count == (uStack_f0 & 0xffffffff)
       ) {
      p_Var1 = &values_inserted._M_t._M_impl.super__Rb_tree_header;
      lVar11 = std::_Rb_tree_decrement(&p_Var1->_M_header);
      if (*(uint *)(lVar11 + 0x20) < (uint)uStack_f0) {
        InstructionBuilder::InstructionBuilder
                  ((InstructionBuilder *)&values_inserted_1,inst->context_,inst,
                   kAnalysisInstrToBlockMapping|kAnalysisBegin);
        local_68[0].data._M_elems = (array<signed_char,_4UL>)0x0;
        local_68[1].data._M_elems = (array<signed_char,_4UL>)0x0;
        _partially_inserted_element_index = (_func_int **)0x0;
        puStack_70 = (pointer)0x0;
        for (p_Var12 = values_inserted._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var12 != p_Var1;
            p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12)) {
          local_48 = *(undefined8 *)(p_Var12 + 1);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     &partially_inserted_element_index,(value_type_conflict1 *)((long)&local_48 + 4)
                    );
        }
        pIVar9 = InstructionBuilder::AddCompositeConstruct
                           ((InstructionBuilder *)&values_inserted_1,uVar4,
                            (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            &partially_inserted_element_index);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &partially_inserted_element_index);
        uVar4 = Instruction::NumInOperands(inst);
        if (uVar4 == 3) {
          inst->opcode_ = OpCopyObject;
          local_dc = Instruction::result_id(pIVar9);
          init_list._M_len = 1;
          init_list._M_array = &local_dc;
          utils::SmallVector<unsigned_int,_2UL>::SmallVector
                    ((SmallVector<unsigned_int,_2UL> *)&partially_inserted_element_index,init_list);
          p_Var1 = &values_inserted_1._M_t._M_impl.super__Rb_tree_header;
          values_inserted_1._M_t._M_impl._0_4_ = 1;
          utils::SmallVector<unsigned_int,_2UL>::SmallVector
                    ((SmallVector<unsigned_int,_2UL> *)p_Var1,
                     (SmallVector<unsigned_int,_2UL> *)&partially_inserted_element_index);
          local_48 = 0;
          uStack_40 = 0;
          local_38 = 0;
          std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
          _M_range_initialize<spvtools::opt::Operand_const*>
                    ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)
                     &local_48,&values_inserted_1,&values_inserted);
          Instruction::SetInOperands(inst,(OperandList *)&local_48);
          std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                    ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                     &local_48);
          utils::SmallVector<unsigned_int,_2UL>::~SmallVector
                    ((SmallVector<unsigned_int,_2UL> *)p_Var1);
          utils::SmallVector<unsigned_int,_2UL>::~SmallVector
                    ((SmallVector<unsigned_int,_2UL> *)&partially_inserted_element_index);
        }
        else {
          uVar4 = Instruction::result_id(pIVar9);
          _partially_inserted_element_index = (_func_int **)CONCAT44(uStack_74,uVar4);
          init_list_00._M_len = 1;
          init_list_00._M_array = &partially_inserted_element_index;
          utils::SmallVector<unsigned_int,_2UL>::SmallVector
                    ((SmallVector<unsigned_int,_2UL> *)&values_inserted_1,init_list_00);
          Instruction::SetInOperand(inst,0,(SmallVector<unsigned_int,_2UL> *)&values_inserted_1);
          utils::SmallVector<unsigned_int,_2UL>::~SmallVector
                    ((SmallVector<unsigned_int,_2UL> *)&values_inserted_1);
          Instruction::RemoveOperand
                    (inst,(int)(((long)(inst->operands_).
                                       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(inst->operands_).
                                      super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                      ._M_impl.super__Vector_impl_data._M_start) / 0x30) - 1);
        }
        bVar3 = true;
        goto LAB_004bc878;
      }
    }
  }
  bVar3 = false;
LAB_004bc878:
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::~_Rb_tree(&values_inserted._M_t);
  return bVar3;
}

Assistant:

bool CompositeInsertToCompositeConstruct(
    IRContext* context, Instruction* inst,
    const std::vector<const analysis::Constant*>&) {
  assert(inst->opcode() == spv::Op::OpCompositeInsert &&
         "Wrong opcode.  Should be OpCompositeInsert.");
  if (inst->NumInOperands() < 3) return false;

  std::map<uint32_t, uint32_t> values_inserted = GetInsertedValues(inst);
  uint32_t container_type_id = GetContainerTypeId(inst);
  if (container_type_id == 0) {
    return false;
  }

  analysis::TypeManager* type_mgr = context->get_type_mgr();
  const analysis::Type* container_type = type_mgr->GetType(container_type_id);
  assert(container_type && "GetContainerTypeId returned a bad id.");
  if (!DoInsertedValuesCoverEntireObject(container_type, values_inserted)) {
    return false;
  }

  Instruction* construct =
      BuildCompositeConstruct(container_type_id, values_inserted, inst);
  InsertConstructedObject(inst, construct);
  return true;
}